

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowStackToolWindow(bool *p_open)

{
  bool *v;
  ImVector<ImGuiStackLevelInfo> *this;
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImU32 color;
  ImVec4 *pIVar6;
  ImGuiStackLevelInfo *pIVar7;
  ImGuiStackLevelInfo *pIVar8;
  int stack_n;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int n;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  char level_desc [256];
  
  pIVar4 = GImGui;
  uVar1 = (GImGui->NextWindowData).Flags;
  if ((uVar1 & 2) == 0) {
    fVar13 = GImGui->FontSize;
    (GImGui->NextWindowData).Flags = uVar1 | 2;
    (pIVar4->NextWindowData).SizeVal.x = 0.0;
    (pIVar4->NextWindowData).SizeVal.y = fVar13 * 8.0;
    (pIVar4->NextWindowData).SizeCond = 4;
  }
  bVar5 = Begin("Dear ImGui Stack Tool",p_open,0);
  if ((!bVar5) ||
     (pIVar2 = GImGui->CurrentWindow, pIVar2->WriteAccessed = true, 1 < pIVar2->BeginCount)) {
    End();
    return;
  }
  Text("HoveredId: 0x%08X, ActiveId:  0x%08X",(ulong)pIVar4->HoveredIdPreviousFrame,
       (ulong)pIVar4->ActiveId);
  SameLine(0.0,-1.0);
  MetricsHelpMarker(
                   "Hover an item with the mouse to display elements of the ID Stack leading to the item\'s final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details."
                   );
  fVar13 = (float)pIVar4->Time - (pIVar4->DebugStackTool).CopyToClipboardLastTime;
  v = &(pIVar4->DebugStackTool).CopyToClipboardOnCtrlC;
  Checkbox("Ctrl+C: copy path to clipboard",v);
  SameLine(0.0,-1.0);
  if ((0.0 <= fVar13) && (fVar13 < 0.75)) {
    fVar13 = fmodf(fVar13,0.25);
    if (fVar13 < 0.125) {
      uVar14 = 0x3f800000;
      uVar15 = 0x3f800000;
      level_desc[8] = -0x66;
      level_desc[9] = -0x67;
      level_desc[10] = -0x67;
      level_desc[0xb] = '>';
      level_desc[0xc] = '\0';
      level_desc[0xd] = '\0';
      level_desc[0xe] = -0x80;
      level_desc[0xf] = '?';
      goto LAB_0015f4dd;
    }
  }
  uVar14 = 0;
  uVar15 = 0;
  level_desc[8] = '\0';
  level_desc[9] = '\0';
  level_desc[10] = '\0';
  level_desc[0xb] = '\0';
  level_desc[0xc] = '\0';
  level_desc[0xd] = '\0';
  level_desc[0xe] = '\0';
  level_desc[0xf] = '\0';
LAB_0015f4dd:
  level_desc[4] = (char)uVar15;
  level_desc[5] = (char)((uint)uVar15 >> 8);
  level_desc[6] = (char)((uint)uVar15 >> 0x10);
  level_desc[7] = (char)((uint)uVar15 >> 0x18);
  level_desc[0] = (char)uVar14;
  level_desc[1] = (char)((uint)uVar14 >> 8);
  level_desc[2] = (char)((uint)uVar14 >> 0x10);
  level_desc[3] = (char)((uint)uVar14 >> 0x18);
  TextColored((ImVec4 *)level_desc,"*COPIED*");
  if (*v == true) {
    bVar5 = IsKeyDown(0x281);
    if (bVar5) {
      bVar5 = IsKeyPressed(0x224,true);
      if (bVar5) {
        (pIVar4->DebugStackTool).CopyToClipboardLastTime = (float)pIVar4->Time;
        lVar11 = 0x5848;
        iVar9 = 0;
        while ((iVar9 < (pIVar4->DebugStackTool).Results.Size && (lVar11 < 0x6446))) {
          (&pIVar4->Initialized)[lVar11] = true;
          StackToolFormatLevelInfo(&pIVar4->DebugStackTool,iVar9,false,level_desc,0x100);
          pIVar6 = (ImVec4 *)level_desc;
          lVar12 = lVar11;
          while( true ) {
            lVar11 = lVar12 + 1;
            bVar5 = *(bool *)&pIVar6->x;
            if ((bVar5 == false) || (0x6445 < lVar12)) break;
            if (bVar5 == true) {
              (&pIVar4->FontAtlasOwnedByContext)[lVar12] = true;
              lVar11 = lVar12 + 2;
            }
            (&pIVar4->Initialized)[lVar11] = bVar5;
            pIVar6 = (ImVec4 *)((long)&pIVar6->x + 1);
            lVar12 = lVar11;
          }
          iVar9 = iVar9 + 1;
        }
        (&pIVar4->Initialized)[lVar11] = false;
        SetClipboardText(pIVar4->TempBuffer);
      }
    }
  }
  (pIVar4->DebugStackTool).LastActiveFrame = pIVar4->FrameCount;
  if (0 < (pIVar4->DebugStackTool).Results.Size) {
    level_desc[0] = '\0';
    level_desc[1] = '\0';
    level_desc[2] = '\0';
    level_desc[3] = '\0';
    level_desc[4] = '\0';
    level_desc[5] = '\0';
    level_desc[6] = '\0';
    level_desc[7] = '\0';
    bVar5 = BeginTable("##table",3,0x780,(ImVec2 *)level_desc,0.0);
    if (bVar5) {
      this = &(pIVar4->DebugStackTool).Results;
      IVar3 = CalcTextSize("0xDDDDDDDD",(char *)0x0,false,-1.0);
      TableSetupColumn("Seed",0x10,IVar3.x,0);
      TableSetupColumn("PushID",8,0.0,0);
      TableSetupColumn("Result",0x10,IVar3.x,0);
      TableHeadersRow();
      for (iVar9 = 0; iVar9 < this->Size; iVar9 = iVar9 + 1) {
        pIVar7 = ImVector<ImGuiStackLevelInfo>::operator[](this,iVar9);
        TableNextColumn();
        if (iVar9 == 0) {
          uVar10 = 0;
        }
        else {
          pIVar8 = ImVector<ImGuiStackLevelInfo>::operator[](this,iVar9 + -1);
          uVar10 = (ulong)pIVar8->ID;
        }
        Text("0x%08X",uVar10);
        TableNextColumn();
        StackToolFormatLevelInfo(&pIVar4->DebugStackTool,iVar9,true,pIVar4->TempBuffer,0xc01);
        TextUnformatted(pIVar4->TempBuffer,(char *)0x0);
        TableNextColumn();
        Text("0x%08X",(ulong)pIVar7->ID);
        if (iVar9 == this->Size + -1) {
          color = GetColorU32(0x18,1.0);
          TableSetBgColor(3,color,-1);
        }
      }
      EndTable();
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowStackToolWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 8.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Stack Tool", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Display hovered/active status
    ImGuiStackTool* tool = &g.DebugStackTool;
    const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
    const ImGuiID active_id = g.ActiveId;
#ifdef IMGUI_ENABLE_TEST_ENGINE
    Text("HoveredId: 0x%08X (\"%s\"), ActiveId:  0x%08X (\"%s\")", hovered_id, hovered_id ? ImGuiTestEngine_FindItemDebugLabel(&g, hovered_id) : "", active_id, active_id ? ImGuiTestEngine_FindItemDebugLabel(&g, active_id) : "");
#else
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X", hovered_id, active_id);
#endif
    SameLine();
    MetricsHelpMarker("Hover an item with the mouse to display elements of the ID Stack leading to the item's final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details.");

    // CTRL+C to copy path
    const float time_since_copy = (float)g.Time - tool->CopyToClipboardLastTime;
    Checkbox("Ctrl+C: copy path to clipboard", &tool->CopyToClipboardOnCtrlC);
    SameLine();
    TextColored((time_since_copy >= 0.0f && time_since_copy < 0.75f && ImFmod(time_since_copy, 0.25f) < 0.25f * 0.5f) ? ImVec4(1.f, 1.f, 0.3f, 1.f) : ImVec4(), "*COPIED*");
    if (tool->CopyToClipboardOnCtrlC && IsKeyDown(ImGuiKey_ModCtrl) && IsKeyPressed(ImGuiKey_C))
    {
        tool->CopyToClipboardLastTime = (float)g.Time;
        char* p = g.TempBuffer;
        char* p_end = p + IM_ARRAYSIZE(g.TempBuffer);
        for (int stack_n = 0; stack_n < tool->Results.Size && p + 3 < p_end; stack_n++)
        {
            *p++ = '/';
            char level_desc[256];
            StackToolFormatLevelInfo(tool, stack_n, false, level_desc, IM_ARRAYSIZE(level_desc));
            for (int n = 0; level_desc[n] && p + 2 < p_end; n++)
            {
                if (level_desc[n] == '/')
                    *p++ = '\\';
                *p++ = level_desc[n];
            }
        }
        *p = '\0';
        SetClipboardText(g.TempBuffer);
    }

    // Display decorated stack
    tool->LastActiveFrame = g.FrameCount;
    if (tool->Results.Size > 0 && BeginTable("##table", 3, ImGuiTableFlags_Borders))
    {
        const float id_width = CalcTextSize("0xDDDDDDDD").x;
        TableSetupColumn("Seed", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableSetupColumn("PushID", ImGuiTableColumnFlags_WidthStretch);
        TableSetupColumn("Result", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableHeadersRow();
        for (int n = 0; n < tool->Results.Size; n++)
        {
            ImGuiStackLevelInfo* info = &tool->Results[n];
            TableNextColumn();
            Text("0x%08X", (n > 0) ? tool->Results[n - 1].ID : 0);
            TableNextColumn();
            StackToolFormatLevelInfo(tool, n, true, g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer));
            TextUnformatted(g.TempBuffer);
            TableNextColumn();
            Text("0x%08X", info->ID);
            if (n == tool->Results.Size - 1)
                TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_Header));
        }
        EndTable();
    }
    End();
}